

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_srtp_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  stack_st_SRTP_PROTECTION_PROFILE *sk;
  Type *pTVar4;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> other;
  SRTP_PROTECTION_PROFILE *profile;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> __end1;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> __begin1;
  stack_st_SRTP_PROTECTION_PROFILE **__range1;
  undefined1 local_50 [6];
  uint16_t profile_id;
  CBS srtp_mki;
  CBS profile_ids;
  SSL *ssl;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = (SSL *)hs->ssl;
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    iVar2 = SSL_is_dtls((SSL *)ssl_00);
    if (iVar2 == 0) {
      __assert_fail("SSL_is_dtls(ssl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x696,
                    "bool bssl::ext_srtp_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
    }
    iVar2 = CBS_get_u16_length_prefixed(contents,(CBS *)&srtp_mki.len);
    if ((((iVar2 != 0) &&
         (iVar2 = CBS_get_u16((CBS *)&srtp_mki.len,(uint16_t *)((long)&__range1 + 6)), iVar2 != 0))
        && (sVar3 = CBS_len((CBS *)&srtp_mki.len), sVar3 == 0)) &&
       ((iVar2 = CBS_get_u8_length_prefixed(contents,(CBS *)local_50), iVar2 != 0 &&
        (sVar3 = CBS_len(contents), sVar3 == 0)))) {
      sVar3 = CBS_len((CBS *)local_50);
      if (sVar3 != 0) {
        ERR_put_error(0x10,0,0x73,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x6a4);
        *out_alert = '/';
        return false;
      }
      sk = (stack_st_SRTP_PROTECTION_PROFILE *)SSL_get_srtp_profiles(ssl_00);
      join_0x00000010_0x00000000_ = begin<stack_st_SRTP_PROTECTION_PROFILE>(sk);
      other = end<stack_st_SRTP_PROTECTION_PROFILE>(sk);
      while( true ) {
        bVar1 = internal::StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE>::operator!=
                          ((StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE> *)&__end1.idx_,other
                          );
        if (!bVar1) {
          ERR_put_error(0x10,0,0x74,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0x6b1);
          *out_alert = '/';
          return false;
        }
        pTVar4 = internal::StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE>::operator*
                           ((StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE> *)&__end1.idx_);
        if (pTVar4->id == (ulong)__range1._6_2_) break;
        internal::StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE>::operator++
                  ((StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE> *)&__end1.idx_);
      }
      *(Type **)(ssl_00->handshake_func + 0x280) = pTVar4;
      return true;
    }
    ERR_put_error(0x10,0,0x74,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x69e);
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_srtp_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                       CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL) {
    return true;
  }

  // The extension consists of a u16-prefixed profile ID list containing a
  // single uint16_t profile ID, then followed by a u8-prefixed srtp_mki field.
  //
  // See https://tools.ietf.org/html/rfc5764#section-4.1.1
  assert(SSL_is_dtls(ssl));
  CBS profile_ids, srtp_mki;
  uint16_t profile_id;
  if (!CBS_get_u16_length_prefixed(contents, &profile_ids) ||  //
      !CBS_get_u16(&profile_ids, &profile_id) ||               //
      CBS_len(&profile_ids) != 0 ||                            //
      !CBS_get_u8_length_prefixed(contents, &srtp_mki) ||      //
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_PROTECTION_PROFILE_LIST);
    return false;
  }

  if (CBS_len(&srtp_mki) != 0) {
    // Must be no MKI, since we never offer one.
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_MKI_VALUE);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // Check to see if the server gave us something we support and offered.
  for (const SRTP_PROTECTION_PROFILE *profile : SSL_get_srtp_profiles(ssl)) {
    if (profile->id == profile_id) {
      ssl->s3->srtp_profile = profile;
      return true;
    }
  }

  OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_PROTECTION_PROFILE_LIST);
  *out_alert = SSL_AD_ILLEGAL_PARAMETER;
  return false;
}